

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICache.cxx
# Opt level: O0

Value * __thiscall anon_unknown.dwarf_817b73::Cache::Dump(Value *__return_storage_ptr__,Cache *this)

{
  Value *this_00;
  Value local_48;
  undefined1 local_19;
  Cache *local_18;
  Cache *this_local;
  Value *cache;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Cache *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  DumpEntries(&local_48,this);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"entries");
  Json::Value::operator=(this_00,&local_48);
  Json::Value::~Value(&local_48);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Cache::Dump()
{
  Json::Value cache = Json::objectValue;
  cache["entries"] = DumpEntries();
  return cache;
}